

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void __thiscall
AlignmentRecord::mergeAlignmentRecordsSingle(AlignmentRecord *this,AlignmentRecord *ar,int i,int j)

{
  pointer *ppcVar1;
  char *pcVar2;
  pointer pCVar3;
  pointer pcVar4;
  iterator iVar5;
  uint *puVar6;
  bool bVar7;
  int iVar8;
  _Alloc_hider _Var9;
  int iVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  undefined4 in_register_0000000c;
  char *pcVar14;
  char *pcVar15;
  undefined4 in_register_00000014;
  size_type sVar16;
  int iVar17;
  vector<int,std::allocator<int>> *pvVar18;
  uint *puVar19;
  AlignmentRecord *this_00;
  char *__end;
  int ref_rel_pos1;
  int ref_s_pos2;
  AlignmentRecord *local_160;
  int ref_s_pos1;
  int ref_rel_pos2;
  undefined8 local_150;
  undefined8 local_148;
  int local_13c;
  int c_pos2;
  int q_pos2;
  int q_pos1;
  int c_pos1;
  vector<char,_std::allocator<char>_> cigar;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string qualities;
  int *local_b8;
  string nucigar;
  string ref;
  string algn;
  string dna;
  
  local_148 = CONCAT44(in_register_00000014,i);
  local_150 = CONCAT44(in_register_0000000c,j);
  dna._M_dataplus._M_p = (pointer)&dna.field_2;
  local_160 = ar;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dna,"","");
  ref._M_dataplus._M_p = (pointer)&ref.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ref,"","");
  algn._M_dataplus._M_p = (pointer)&algn.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&algn,"");
  qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&qualities,"");
  nucigar._M_dataplus._M_p = (pointer)&nucigar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nucigar,"");
  if ((int)local_148 == 1) {
    pcVar2 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar15 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pcVar2 == pcVar15) {
      iVar17 = 0;
    }
    else {
      iVar17 = 0;
      do {
        pcVar14 = pcVar2 + 1;
        if ((*pcVar2 == 'S') || (bVar7 = true, *pcVar2 == 'H')) {
          iVar17 = iVar17 + 1;
          bVar7 = false;
        }
      } while ((!bVar7) && (pcVar2 = pcVar14, pcVar14 != pcVar15));
    }
    iVar10 = computeRevOffset(&this->cigar1_unrolled);
    iVar10 = iVar10 + this->end1;
    ref_s_pos1 = this->start1 - iVar17;
    if ((int)local_150 == 1) {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_160->cigar1_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar17 = 0;
      }
      else {
        iVar17 = 0;
        pcVar2 = cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pcVar15 = pcVar2 + 1;
          if ((*pcVar2 == 'S') || (bVar7 = true, *pcVar2 == 'H')) {
            iVar17 = iVar17 + 1;
            bVar7 = false;
          }
        } while ((!bVar7) &&
                (pcVar2 = pcVar15,
                pcVar15 !=
                cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish));
      }
      iVar11 = computeRevOffset(&cigar);
      ref_s_pos2 = local_160->start1 - iVar17;
      iVar11 = iVar11 + local_160->end1;
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_160->cigar2_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar17 = 0;
      }
      else {
        iVar17 = 0;
        pcVar2 = cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pcVar15 = pcVar2 + 1;
          if ((*pcVar2 == 'S') || (bVar7 = true, *pcVar2 == 'H')) {
            iVar17 = iVar17 + 1;
            bVar7 = false;
          }
        } while ((!bVar7) &&
                (pcVar2 = pcVar15,
                pcVar15 !=
                cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish));
      }
      iVar11 = computeRevOffset(&cigar);
      ref_s_pos2 = local_160->start2 - iVar17;
      iVar11 = iVar11 + local_160->end2;
    }
  }
  else {
    pcVar2 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar15 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pcVar2 == pcVar15) {
      iVar17 = 0;
    }
    else {
      iVar17 = 0;
      do {
        pcVar14 = pcVar2 + 1;
        if ((*pcVar2 == 'S') || (bVar7 = true, *pcVar2 == 'H')) {
          iVar17 = iVar17 + 1;
          bVar7 = false;
        }
      } while ((!bVar7) && (pcVar2 = pcVar14, pcVar14 != pcVar15));
    }
    iVar10 = computeRevOffset(&this->cigar2_unrolled);
    ref_s_pos1 = this->start2 - iVar17;
    iVar10 = iVar10 + this->end2;
    if ((int)local_150 == 1) {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_160->cigar1_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar17 = 0;
      }
      else {
        iVar17 = 0;
        pcVar2 = cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pcVar15 = pcVar2 + 1;
          if ((*pcVar2 == 'S') || (bVar7 = true, *pcVar2 == 'H')) {
            iVar17 = iVar17 + 1;
            bVar7 = false;
          }
        } while ((!bVar7) &&
                (pcVar2 = pcVar15,
                pcVar15 !=
                cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish));
      }
      iVar11 = computeRevOffset(&cigar);
      ref_s_pos2 = local_160->start1 - iVar17;
      iVar11 = iVar11 + local_160->end1;
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_160->cigar2_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar17 = 0;
      }
      else {
        iVar17 = 0;
        pcVar2 = cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pcVar15 = pcVar2 + 1;
          if ((*pcVar2 == 'S') || (bVar7 = true, *pcVar2 == 'H')) {
            iVar17 = iVar17 + 1;
            bVar7 = false;
          }
        } while ((!bVar7) &&
                (pcVar2 = pcVar15,
                pcVar15 !=
                cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish));
      }
      iVar11 = computeRevOffset(&cigar);
      ref_s_pos2 = local_160->start2 - iVar17;
      iVar11 = iVar11 + local_160->end2;
    }
  }
  if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar8 = ref_s_pos1;
  iVar17 = ref_s_pos2;
  q_pos1 = 0;
  q_pos2 = 0;
  c_pos1 = 0;
  c_pos2 = 0;
  ref_rel_pos1 = 0;
  ref_rel_pos2 = 0;
  if ((ref_s_pos2 < ref_s_pos1) || (iVar11 < iVar10)) {
    if ((ref_s_pos2 < ref_s_pos1) || (iVar10 < iVar11)) {
      if ((ref_s_pos2 <= ref_s_pos1) && (iVar10 <= iVar11)) {
        local_13c = iVar11;
        while (ref_s_pos2 < iVar8) {
          noOverlapMerge(local_160,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                         &ref_rel_pos2,(int)local_150);
        }
        while (ref_s_pos2 <= iVar10) {
          overlapMerge(this,&algn,&ref,local_160,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                       &q_pos2,&ref_s_pos2,&ref_rel_pos1,(int)local_148,(int)local_150);
        }
        ref_rel_pos2 = ref_rel_pos1 + ref_rel_pos2 + -1;
        while (ref_s_pos2 <= local_13c) {
          noOverlapMerge(local_160,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                         &ref_rel_pos2,(int)local_150);
        }
        goto LAB_00168ebe;
      }
      while (ref_s_pos2 < iVar8) {
        noOverlapMerge(local_160,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                       &ref_rel_pos2,(int)local_150);
      }
      while (ref_s_pos2 <= iVar11) {
        overlapMerge(this,&algn,&ref,local_160,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                     &q_pos2,&ref_s_pos2,&ref_rel_pos1,(int)local_148,(int)local_150);
      }
      while (ref_s_pos2 <= iVar10) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos2,
                       &ref_rel_pos1,(int)local_148);
      }
    }
    else {
      local_13c = iVar10;
      while (ref_s_pos1 < iVar17) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                       &ref_rel_pos1,(int)local_148);
      }
      while (ref_s_pos1 <= iVar11) {
        overlapMerge(this,&algn,&ref,local_160,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                     &q_pos2,&ref_s_pos1,&ref_rel_pos1,(int)local_148,(int)local_150);
      }
      while (ref_s_pos1 <= local_13c) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                       &ref_rel_pos1,(int)local_148);
      }
    }
    local_b8 = &ref_rel_pos1;
    iVar17 = (int)local_148;
    this_00 = this;
  }
  else {
    local_13c = iVar11;
    while (iVar11 = ref_rel_pos1, ref_s_pos1 < iVar17) {
      noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                     &ref_rel_pos1,(int)local_148);
    }
    ref_rel_pos2 = ref_rel_pos1;
    while (ref_s_pos1 <= iVar10) {
      overlapMerge(this,&algn,&ref,local_160,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                   &q_pos2,&ref_s_pos1,&ref_rel_pos1,(int)local_148,(int)local_150);
    }
    ref_rel_pos2 = ref_rel_pos1 - iVar11;
    while (ref_s_pos1 <= local_13c) {
      noOverlapMerge(local_160,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos1,
                     &ref_rel_pos2,(int)local_150);
    }
LAB_00168ebe:
    local_b8 = &ref_rel_pos2;
    iVar17 = (int)local_150;
    this_00 = local_160;
  }
  updateReference(this_00,&ref,iVar17,*local_b8);
  if ((int)local_148 == 1) {
    uVar12 = this->start1;
    if ((int)local_150 == 1) {
      if (local_160->start1 < uVar12) {
        uVar12 = local_160->start1;
      }
      this->start1 = uVar12;
      uVar12 = this->end1;
      if (this->end1 < local_160->end1) {
        uVar12 = local_160->end1;
      }
      this->end1 = uVar12;
      this->single_end = true;
      createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
      pCVar3 = (this->cigar1).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pCVar3 != (pointer)0x0) {
        operator_delete(pCVar3);
      }
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward,
                (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).forward_qualities,&local_110);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward,&local_100);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&(this->sequence1).backward_qualities,&local_f0);
      ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
      if (qualities._M_string_length == 0) {
        iVar17 = 0;
      }
      else {
        sVar16 = 0;
        iVar17 = 0;
        do {
          iVar17 = iVar17 + qualities._M_dataplus._M_p[sVar16] + -0x21;
          sVar16 = sVar16 + 1;
        } while (qualities._M_string_length != sVar16);
      }
      this->phred_sum1 = iVar17;
      sVar13 = ShortDnaSequence::size(&this->sequence1);
      this->length_incl_deletions1 = (int)sVar13;
      sVar13 = ShortDnaSequence::size(&this->sequence1);
      _Var9 = nucigar._M_dataplus;
      this->length_incl_longdeletions1 = (int)sVar13;
      pcVar4 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar4) {
        (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar4;
      }
      if (nucigar._M_string_length != 0) {
        sVar16 = 0;
        do {
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT71(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                       .super__Vector_impl_data._M_start._1_7_,_Var9._M_p[sVar16]);
          iVar5._M_current =
               (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&this->cigar1_unrolled,iVar5,
                       (char *)&cigar);
          }
          else {
            *iVar5._M_current = _Var9._M_p[sVar16];
            ppcVar1 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          sVar16 = sVar16 + 1;
        } while (nucigar._M_string_length != sVar16);
      }
      std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
      std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
      pvVar18 = (vector<int,std::allocator<int>> *)&this->qualityList1;
      goto LAB_00169545;
    }
    if (local_160->start2 < uVar12) {
      uVar12 = local_160->start2;
    }
    this->start2 = uVar12;
    uVar12 = local_160->end2;
    if (local_160->end2 < this->end1) {
      uVar12 = this->end1;
    }
    this->end2 = uVar12;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
    pCVar3 = (this->cigar2).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pCVar3 != (pointer)0x0) {
      operator_delete(pCVar3);
    }
    if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,&local_110);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,&local_100);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,&local_f0);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
    if (qualities._M_string_length == 0) {
      iVar17 = 0;
    }
    else {
      sVar16 = 0;
      iVar17 = 0;
      do {
        iVar17 = iVar17 + qualities._M_dataplus._M_p[sVar16] + -0x21;
        sVar16 = sVar16 + 1;
      } while (qualities._M_string_length != sVar16);
    }
    this->phred_sum2 = iVar17;
    sVar13 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_deletions2 = (int)sVar13;
    sVar13 = ShortDnaSequence::size(&this->sequence2);
    _Var9 = nucigar._M_dataplus;
    this->length_incl_longdeletions2 = (int)sVar13;
    pcVar4 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar4) {
      (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4;
    }
    if (nucigar._M_string_length != 0) {
      sVar16 = 0;
      do {
        cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT71(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start._1_7_,_Var9._M_p[sVar16]);
        iVar5._M_current =
             (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->cigar2_unrolled,iVar5,
                     (char *)&cigar);
        }
        else {
          *iVar5._M_current = _Var9._M_p[sVar16];
          ppcVar1 = &(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        sVar16 = sVar16 + 1;
      } while (nucigar._M_string_length != sVar16);
    }
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
  }
  else {
    this->single_end = false;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
    pCVar3 = (this->cigar2).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pCVar3 != (pointer)0x0) {
      operator_delete(pCVar3);
    }
    if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,&local_110);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,&local_100);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,&local_f0);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
    if (qualities._M_string_length == 0) {
      iVar17 = 0;
    }
    else {
      sVar16 = 0;
      iVar17 = 0;
      do {
        iVar17 = iVar17 + qualities._M_dataplus._M_p[sVar16] + -0x21;
        sVar16 = sVar16 + 1;
      } while (qualities._M_string_length != sVar16);
    }
    this->phred_sum2 = iVar17;
    sVar13 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_deletions2 = (int)sVar13;
    sVar13 = ShortDnaSequence::size(&this->sequence2);
    _Var9 = nucigar._M_dataplus;
    this->length_incl_longdeletions2 = (int)sVar13;
    pcVar4 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar4) {
      (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4;
    }
    if (nucigar._M_string_length != 0) {
      sVar16 = 0;
      do {
        cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT71(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start._1_7_,_Var9._M_p[sVar16]);
        iVar5._M_current =
             (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->cigar2_unrolled,iVar5,
                     (char *)&cigar);
        }
        else {
          *iVar5._M_current = _Var9._M_p[sVar16];
          ppcVar1 = &(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        sVar16 = sVar16 + 1;
      } while (nucigar._M_string_length != sVar16);
    }
    puVar6 = &local_160->start1;
    puVar19 = &local_160->end1;
    if ((int)local_150 != 1) {
      puVar19 = &local_160->end2;
      puVar6 = &local_160->start2;
    }
    uVar12 = this->start2;
    if (*puVar6 < this->start2) {
      uVar12 = *puVar6;
    }
    this->start2 = uVar12;
    uVar12 = this->end2;
    if (this->end2 < *puVar19) {
      uVar12 = *puVar19;
    }
    this->end2 = uVar12;
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
  }
  pvVar18 = (vector<int,std::allocator<int>> *)&this->qualityList2;
LAB_00169545:
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pvVar18,qualities._M_dataplus._M_p,
             qualities._M_dataplus._M_p + qualities._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nucigar._M_dataplus._M_p != &nucigar.field_2) {
    operator_delete(nucigar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qualities._M_dataplus._M_p != &qualities.field_2) {
    operator_delete(qualities._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)algn._M_dataplus._M_p != &algn.field_2) {
    operator_delete(algn._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref._M_dataplus._M_p != &ref.field_2) {
    operator_delete(ref._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dna._M_dataplus._M_p != &dna.field_2) {
    operator_delete(dna._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsSingle(const AlignmentRecord& ar, int i, int j){
    std::string dna = "";
    std::string ref = "";
    std::string algn = "";
    std::string qualities = "";
    std::string nucigar = "";
    int offset_f1, offset_f2, offset_b1, offset_b2, ref_s_pos1, ref_e_pos1, ref_s_pos2,ref_e_pos2 = 0;
    //i and j determine which cigar strings / sequences are considered

    if (i == 1){
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar1_unrolled);
         offset_b1 = computeRevOffset(this->cigar1_unrolled);
         ref_e_pos1 = this->end1+offset_b1;
         ref_s_pos1 = this->start1-offset_f1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    } else {
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar2_unrolled);
         offset_b1 = computeRevOffset(this->cigar2_unrolled);
         ref_s_pos1 = this->start2-offset_f1;
         ref_e_pos1 = this->end2+offset_b1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    }

    //position in query sequences // phred scores
    int q_pos1 = 0;
    int q_pos2 = 0;
    //position in unrolled cigar vectors
    int c_pos1 = 0;
    int c_pos2 = 0;
    //Position in the reference strings
    int ref_rel_pos1 =0;
    int ref_rel_pos2 =0;
    //4 cases of different overlaps
    //------------
    //     ------------
    if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        ref_rel_pos2 = ref_rel_pos1;
        while(ref_s_pos1<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 = ref_rel_pos1-ref_rel_pos2;
        while(ref_s_pos1<=ref_e_pos2){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos1,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);

    }//------------------------------
        //           ----------
     else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        while(ref_s_pos1<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        while(ref_s_pos1<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);
        //           ----------
        //--------------------------
    } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 += ref_rel_pos1-1;
        while(ref_s_pos2<=ref_e_pos2){//Why is it less that equals here?Check with paper
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);
        //           --------------------
        //---------------------
    } else {
        assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar, c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar, c_pos1,q_pos1,ref_s_pos2,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);

    }
    if (i == 1){
        if(j == 1){
            this->start1 = std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end1);
            this->single_end= true;
            this->cigar1 = createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());

        } else {
            this->start2 = std::min(this->start1,ar.getStart2());
            this->end2 = std::max(this->end1,ar.getEnd2());
            this->cigar2 = createCigar(nucigar);
            this->sequence2=ShortDnaSequence(dna,qualities);
            this->phred_sum2=phred_sum(qualities);
            this->length_incl_deletions2 = this->sequence2.size();
            this->length_incl_longdeletions2 = this->sequence2.size();
            this->cigar2_unrolled.clear();
            for (char i : nucigar){
                this->cigar2_unrolled.push_back(i);
            }
            this->reference_seq2 = ref;
            this->alignSequence2 = algn;
            this->qualityList2.assign(qualities.begin(),qualities.end());
        }
    } else {
        this->single_end= false;
        this->cigar2 = createCigar(nucigar);
        this->sequence2=ShortDnaSequence(dna,qualities);
        this->phred_sum2=phred_sum(qualities);
        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        this->cigar2_unrolled.clear();
        for (char i : nucigar){
            this->cigar2_unrolled.push_back(i);
        }
        if(j == 1){
            this->start2 = std::min(this->start2,ar.getStart1());
            this->end2=std::max(ar.getEnd1(),this->end2);

        }else {
            this->start2 = std::min(this->start2,ar.getStart2());
            this->end2=std::max(ar.getEnd2(),this->end2);
        }
        this->reference_seq2 = ref;
        this->alignSequence2 = algn;
        this->qualityList2.assign(qualities.begin(),qualities.end());
    }
}